

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_test.cc
# Opt level: O0

void __thiscall
sample_after_nomalizing_degenerate::test_method(sample_after_nomalizing_degenerate *this)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> pdf_last;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  bool bVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  int scode;
  uint32_t chosen_index;
  vector<float,_std::allocator<float>_> expected;
  vector<float,_std::allocator<float>_> pdf;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe78;
  basic_cstring<const_char> *in_stack_fffffffffffffe80;
  lazy_ostream *in_stack_fffffffffffffe88;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffea8;
  undefined8 uVar2;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  iterator in_stack_fffffffffffffeb8;
  size_type in_stack_fffffffffffffec0;
  undefined1 local_124 [20];
  undefined1 local_110 [40];
  undefined1 local_e8 [16];
  basic_cstring<const_char> local_d8;
  float *local_c8;
  float *local_c0;
  int local_b4 [3];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  undefined8 *local_88;
  undefined8 local_80;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  float in_stack_fffffffffffffff4;
  
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_30 = &local_48;
  local_28 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1b1dc6);
  __l._M_len = in_stack_fffffffffffffec0;
  __l._M_array = in_stack_fffffffffffffeb8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),__l,
             in_stack_fffffffffffffea8);
  std::allocator<float>::~allocator((allocator<float> *)0x1b1df7);
  local_a8 = 0x3f800000;
  uStack_a0 = 0;
  local_98 = 0;
  local_88 = &local_a8;
  local_80 = 5;
  std::allocator<float>::allocator((allocator<float> *)0x1b1e55);
  __l_00._M_len = in_stack_fffffffffffffec0;
  __l_00._M_array = in_stack_fffffffffffffeb8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),__l_00,
             in_stack_fffffffffffffea8);
  std::allocator<float>::~allocator((allocator<float> *)0x1b1e86);
  local_c0 = (float *)std::begin<std::vector<float,std::allocator<float>>>
                                (in_stack_fffffffffffffe78);
  local_c8 = (float *)std::end<std::vector<float,std::allocator<float>>>(in_stack_fffffffffffffe78);
  pdf_last._M_current._7_1_ = in_stack_fffffffffffffe9f;
  pdf_last._M_current._0_7_ = in_stack_fffffffffffffe98;
  local_b4[0] = exploration::
                sample_after_normalizing<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                          ((uint64_t)in_stack_fffffffffffffe90,in_stack_fffffffffffffea0,pdf_last,
                           (uint32_t *)in_stack_fffffffffffffe88);
  do {
    uVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6f);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffffe80);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar2,&local_d8,0x2d,local_e8);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe88,(char (*) [1])in_stack_fffffffffffffe80);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_124 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/test/unit_test/explore_test.cc"
               ,0x6f);
    local_124._0_4_ = 0;
    in_stack_fffffffffffffe88 = (lazy_ostream *)0x4954d3;
    in_stack_fffffffffffffe80 = (basic_cstring<const_char> *)local_124;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_110,local_124 + 4,0x2d,1,2,local_b4,"scode");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x1b1fea);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  check_float_vectors(unaff_retaddr,in_RDI,in_stack_fffffffffffffff4);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe90);
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffe90);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sample_after_nomalizing_degenerate) {
  std::vector<float> pdf = { 0.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  const std::vector<float> expected = { 1.0f, 0.0f, 0.0f, 0.0f, 0.0f };
  uint32_t chosen_index;

  const auto scode = exploration::sample_after_normalizing(7791, begin(pdf), end(pdf), chosen_index);
  BOOST_CHECK_EQUAL(scode, S_EXPLORATION_OK);
  check_float_vectors(pdf, expected, .0001f);
}